

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

Result * __thiscall
banksia::ChessBoard::probeSyzygy
          (Result *__return_storage_ptr__,ChessBoard *this,int maxPieces,bool *tberror)

{
  Side SVar1;
  int iVar2;
  uint uVar3;
  Piece PVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong _rooks;
  byte bVar9;
  uint _castling;
  int i;
  ulong _queens;
  ulong local_378;
  ulong local_370;
  ulong local_368;
  ulong local_360;
  uint64_t bm [2];
  uint results [193];
  
  *tberror = false;
  Result::Result(__return_storage_ptr__);
  if (((Tablebase::SyzygyTablebase::TB_LARGEST != 0) &&
      (iVar2 = toPieceCount(this,(int *)0x0), iVar2 <= maxPieces)) &&
     (iVar2 <= Tablebase::SyzygyTablebase::TB_LARGEST)) {
    bm[0] = 0;
    bm[1] = 0;
    local_370 = 0;
    _queens = 0;
    _rooks = 0;
    local_378 = 0;
    local_360 = 0;
    local_368 = 0;
    for (iVar2 = 0; iVar2 != 0x40; iVar2 = iVar2 + 1) {
      PVar4 = BoardCore::getPiece(&this->super_BoardCore,iVar2);
      if (PVar4.type != empty) {
        uVar8 = 1L << (((byte)iVar2 ^ 0x38) & 0x3f);
        bm[(long)PVar4 >> 0x20] = bm[(long)PVar4 >> 0x20] | uVar8;
        switch(PVar4.type) {
        case king:
          local_370 = local_370 | uVar8;
          break;
        case queen:
          _queens = _queens | uVar8;
          break;
        case rook:
          _rooks = _rooks | uVar8;
          break;
        case bishop:
          local_378 = local_378 | uVar8;
          break;
        case knight:
          local_360 = local_360 | uVar8;
          break;
        case pawn:
          local_368 = local_368 | uVar8;
        }
      }
    }
    uVar7 = (uint)this->castleRights[0];
    uVar5 = (uint)this->castleRights[1];
    uVar3 = 0;
    _castling = 0;
    if (uVar7 + uVar5 != 0) {
      bVar9 = ((this->CastleRight_short & uVar7) != 0) * '\x04';
      bVar6 = bVar9 + 8;
      if ((this->CastleRight_long & uVar7) == 0) {
        bVar6 = bVar9;
      }
      bVar6 = (this->CastleRight_short & uVar5) != 0 | bVar6;
      bVar9 = bVar6 + 2;
      if ((this->CastleRight_long & uVar5) == 0) {
        bVar9 = bVar6;
      }
      _castling = (uint)bVar9;
    }
    SVar1 = (this->super_BoardCore).side;
    uVar5 = this->enpassant;
    if (0 < (int)uVar5) {
      uVar3 = ((uVar5 & 7) - (uVar5 & 0xf8)) + 0x38 & 0xff;
    }
    uVar3 = Tablebase::SyzygyTablebase::tb_probe_root
                      (bm[1],bm[0],local_370,_queens,_rooks,local_378,local_360,local_368,
                       (uint)(byte)(this->super_BoardCore).quietCnt,_castling,uVar3,SVar1 == white,
                       results);
    if (uVar3 == 0xffffffff) {
      *tberror = true;
    }
    else {
      uVar5 = 4 - (uVar3 & 0xf);
      if (SVar1 == white) {
        uVar5 = uVar3 & 0xf;
      }
      __return_storage_ptr__->result = probeSyzygy::typeArray[uVar5];
      __return_storage_ptr__->reason = adjudication;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result ChessBoard::probeSyzygy(int maxPieces, bool& tberror) const
{
    tberror = false;
    Result result;
    if (!Tablebase::SyzygyTablebase::TB_LARGEST) {
        return result;
    }
    
    auto total = toPieceCount(nullptr);
    if (total > maxPieces || total > Tablebase::SyzygyTablebase::TB_LARGEST) {
        return result;
    }
    
    SyzygyPos pos;
    memset(&pos, 0, sizeof(pos));
    
    uint64_t bm[2] = { 0, 0 };
    
    for(int i = 0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) continue;
        auto sd = static_cast<int>(piece.side);
        
        uint64_t b = 1ULL << ((7 - (i >> 3)) * 8 + (i & 0x7));
        bm[sd] |= b;
        
        switch (piece.type) {
            case PieceType::king:
                pos.kings |= b;
                break;
            case PieceType::queen:
                pos.queens |= b;
                break;
            case PieceType::rook:
                pos.rooks |= b;
                break;
            case PieceType::bishop:
                pos.bishops |= b;
                break;
            case PieceType::knight:
                pos.knights |= b;
                break;
            case PieceType::pawn:
                pos.pawns |= b;
                break;
                
            default:
                break;
        }
    }
    
    pos.white = bm[W];
    pos.black = bm[B];
    pos.turn = side == Side::white ? 1 : 0;
    
    if (castleRights[0] + castleRights[1]) {
        if (castleRights[B] & CastleRight_short) {
            pos.castling |= TB_CASTLING_k;
        }
        if (castleRights[B] & CastleRight_long) {
            pos.castling |= TB_CASTLING_q;
        }
        if (castleRights[W] & CastleRight_short) {
            pos.castling |= TB_CASTLING_K;
        }
        if (castleRights[W] & CastleRight_long) {
            pos.castling |= TB_CASTLING_Q;
        }
    }
    
    if (enpassant > 0) {
        pos.ep = (7 - (enpassant >> 3)) * 8 + (enpassant & 0x7);
    }
    
    pos.rule50 = quietCnt;
    
    unsigned results[TB_MAX_MOVES];
    unsigned res = Tablebase::SyzygyTablebase::tb_probe_root(pos.white, pos.black, pos.kings,
                                            pos.queens, pos.rooks, pos.bishops, pos.knights, pos.pawns,
                                            pos.rule50, pos.castling, pos.ep, pos.turn, results);
    if (res == TB_RESULT_FAILED)
    {
//        printOut();
//        std::cerr << "Error: unable to probe tablebase; position invalid, illegal or not in tablebase" << std::endl;
        tberror = true;
        return result;
    }
    
    // (3) Output:
    unsigned wdl = TB_GET_WDL(res);
    
    static const ResultType typeArray[] = {
        ResultType::loss,
        ResultType::draw, ResultType::draw, ResultType::draw,
        ResultType::win
    };
    
    result.result = typeArray[pos.turn? wdl: 4 - wdl];
    result.reason = ReasonType::adjudication;
    return result;
}